

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O0

bool __thiscall antlr::BaseAST::equalsTree(BaseAST *this,RefAST *t)

{
  byte bVar1;
  int iVar2;
  AST *pAVar3;
  AST *this_00;
  ASTRefCount<antlr::AST> *in_RSI;
  long *in_RDI;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  ASTRefCount<antlr::AST> *in_stack_ffffffffffffff60;
  ASTRefCount local_50 [8];
  undefined1 local_48 [8];
  ASTRefCount<antlr::AST> local_40;
  ASTRefCount local_38 [24];
  undefined1 local_20 [31];
  bool local_1;
  
  ASTRefCount<antlr::AST>::ASTRefCount
            (in_stack_ffffffffffffff60,
             (ASTRefCount<antlr::AST> *)
             CONCAT17(in_stack_ffffffffffffff5f,
                      CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
  bVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_20);
  ASTRefCount<antlr::AST>::~ASTRefCount(in_stack_ffffffffffffff60);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    (**(code **)(*in_RDI + 0x68))();
    pAVar3 = ASTRefCount::operator_cast_to_AST_(local_38);
    ASTRefCount<antlr::AST>::~ASTRefCount(in_stack_ffffffffffffff60);
    if (pAVar3 == (AST *)0x0) {
      pAVar3 = ASTRefCount<antlr::AST>::operator->(in_RSI);
      (*pAVar3->_vptr_AST[0xd])();
      pAVar3 = ASTRefCount::operator_cast_to_AST_(local_50);
      ASTRefCount<antlr::AST>::~ASTRefCount(in_stack_ffffffffffffff60);
      if (pAVar3 != (AST *)0x0) {
        return false;
      }
    }
    else {
      (**(code **)(*in_RDI + 0x68))();
      pAVar3 = ASTRefCount<antlr::AST>::operator->(&local_40);
      this_00 = ASTRefCount<antlr::AST>::operator->(in_RSI);
      (*this_00->_vptr_AST[0xd])(local_48);
      iVar2 = (*pAVar3->_vptr_AST[5])(pAVar3,local_48);
      bVar1 = (byte)iVar2 ^ 0xff;
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)this_00);
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)this_00);
      if ((bVar1 & 1) != 0) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool BaseAST::equalsTree(RefAST t) const
{
	// check roots first
	if (!equals(t))
		return false;
	// if roots match, do full list match test on children.
	if (getFirstChild()) {
		if (!getFirstChild()->equalsList(t->getFirstChild()))
			return false;
	}
	// sibling has no kids, make sure t doesn't either
	else if (t->getFirstChild())
		return false;

	return true;
}